

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O2

int run_test_pipe_getsockname_abstract(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t len;
  sockaddr_un sun;
  char buf [1024];
  
  iVar1 = socket(1,1,0);
  if (iVar1 == -1) {
    pcVar5 = "sock != -1";
    uVar4 = 0xaf;
  }
  else {
    sun.sun_path[0xb] = '\0';
    sun.sun_path[0xc] = '\0';
    sun.sun_path[0xd] = '\0';
    sun.sun_path[0xe] = '\0';
    sun.sun_path[0xf] = '\0';
    sun.sun_path[0x10] = '\0';
    sun.sun_path[0x11] = '\0';
    sun.sun_path[0x12] = '\0';
    sun.sun_path[0x13] = '\0';
    sun.sun_path[0x14] = '\0';
    sun.sun_path[0x15] = '\0';
    sun.sun_path[0x16] = '\0';
    sun.sun_path[0x17] = '\0';
    sun.sun_path[0x18] = '\0';
    sun.sun_path[0x19] = '\0';
    sun.sun_path[0x5a] = '\0';
    sun.sun_path[0x5b] = '\0';
    sun.sun_path[0x5c] = '\0';
    sun.sun_path[0x5d] = '\0';
    sun.sun_path[0x5e] = '\0';
    sun.sun_path[0x5f] = '\0';
    sun.sun_path[0x60] = '\0';
    sun.sun_path[0x61] = '\0';
    sun.sun_path[0x62] = '\0';
    sun.sun_path[99] = '\0';
    sun.sun_path[100] = '\0';
    sun.sun_path[0x65] = '\0';
    sun.sun_path[0x66] = '\0';
    sun.sun_path[0x67] = '\0';
    sun.sun_path[0x68] = '\0';
    sun.sun_path[0x69] = '\0';
    sun.sun_path[0x4a] = '\0';
    sun.sun_path[0x4b] = '\0';
    sun.sun_path[0x4c] = '\0';
    sun.sun_path[0x4d] = '\0';
    sun.sun_path[0x4e] = '\0';
    sun.sun_path[0x4f] = '\0';
    sun.sun_path[0x50] = '\0';
    sun.sun_path[0x51] = '\0';
    sun.sun_path[0x52] = '\0';
    sun.sun_path[0x53] = '\0';
    sun.sun_path[0x54] = '\0';
    sun.sun_path[0x55] = '\0';
    sun.sun_path[0x56] = '\0';
    sun.sun_path[0x57] = '\0';
    sun.sun_path[0x58] = '\0';
    sun.sun_path[0x59] = '\0';
    sun.sun_path[0x3a] = '\0';
    sun.sun_path[0x3b] = '\0';
    sun.sun_path[0x3c] = '\0';
    sun.sun_path[0x3d] = '\0';
    sun.sun_path[0x3e] = '\0';
    sun.sun_path[0x3f] = '\0';
    sun.sun_path[0x40] = '\0';
    sun.sun_path[0x41] = '\0';
    sun.sun_path[0x42] = '\0';
    sun.sun_path[0x43] = '\0';
    sun.sun_path[0x44] = '\0';
    sun.sun_path[0x45] = '\0';
    sun.sun_path[0x46] = '\0';
    sun.sun_path[0x47] = '\0';
    sun.sun_path[0x48] = '\0';
    sun.sun_path[0x49] = '\0';
    sun.sun_path[0x2a] = '\0';
    sun.sun_path[0x2b] = '\0';
    sun.sun_path[0x2c] = '\0';
    sun.sun_path[0x2d] = '\0';
    sun.sun_path[0x2e] = '\0';
    sun.sun_path[0x2f] = '\0';
    sun.sun_path[0x30] = '\0';
    sun.sun_path[0x31] = '\0';
    sun.sun_path[0x32] = '\0';
    sun.sun_path[0x33] = '\0';
    sun.sun_path[0x34] = '\0';
    sun.sun_path[0x35] = '\0';
    sun.sun_path[0x36] = '\0';
    sun.sun_path[0x37] = '\0';
    sun.sun_path[0x38] = '\0';
    sun.sun_path[0x39] = '\0';
    sun.sun_path[0x1a] = '\0';
    sun.sun_path[0x1b] = '\0';
    sun.sun_path[0x1c] = '\0';
    sun.sun_path[0x1d] = '\0';
    sun.sun_path[0x1e] = '\0';
    sun.sun_path[0x1f] = '\0';
    sun.sun_path[0x20] = '\0';
    sun.sun_path[0x21] = '\0';
    sun.sun_path[0x22] = '\0';
    sun.sun_path[0x23] = '\0';
    sun.sun_path[0x24] = '\0';
    sun.sun_path[0x25] = '\0';
    sun.sun_path[0x26] = '\0';
    sun.sun_path[0x27] = '\0';
    sun.sun_path[0x28] = '\0';
    sun.sun_path[0x29] = '\0';
    sun.sun_path[0x6a] = '\0';
    sun.sun_path[0x6b] = '\0';
    sun.sun_family = 1;
    sun.sun_path[0] = '\0';
    sun.sun_path[1] = 't';
    sun.sun_path[2] = 'e';
    sun.sun_path[3] = 's';
    sun.sun_path[4] = 't';
    sun.sun_path[5] = '-';
    sun.sun_path[6] = 'p';
    sun.sun_path[7] = 'i';
    sun.sun_path[8] = 'p';
    sun.sun_path[9] = 'e';
    sun.sun_path[10] = '\0';
    iVar2 = bind(iVar1,(sockaddr *)&sun,0x6e);
    if (iVar2 == 0) {
      puVar3 = uv_default_loop();
      iVar2 = uv_pipe_init(puVar3,&pipe_server,0);
      if (iVar2 == 0) {
        iVar2 = uv_pipe_open(&pipe_server,iVar1);
        if (iVar2 == 0) {
          len = 0x400;
          iVar2 = uv_pipe_getsockname(&pipe_server,buf,&len);
          if (iVar2 == 0) {
            iVar2 = bcmp(buf,&DAT_00189565,0xb);
            if (iVar2 == 0) {
              uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
              puVar3 = uv_default_loop();
              uv_run(puVar3,UV_RUN_DEFAULT);
              close(iVar1);
              if (pipe_close_cb_called == 1) {
                puVar3 = uv_default_loop();
                close_loop(puVar3);
                puVar3 = uv_default_loop();
                iVar1 = uv_loop_close(puVar3);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                uVar4 = 0xcb;
              }
              else {
                pcVar5 = "pipe_close_cb_called == 1";
                uVar4 = 0xca;
              }
            }
            else {
              pcVar5 = "memcmp(buf, abstract_pipe, sizeof abstract_pipe) == 0";
              uVar4 = 0xc2;
            }
          }
          else {
            pcVar5 = "r == 0";
            uVar4 = 0xc0;
          }
        }
        else {
          pcVar5 = "r == 0";
          uVar4 = 0xbc;
        }
      }
      else {
        pcVar5 = "r == 0";
        uVar4 = 0xba;
      }
    }
    else {
      pcVar5 = "r == 0";
      uVar4 = 0xb7;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(pipe_getsockname_abstract) {
#if defined(__linux__)
  char buf[1024];
  size_t len;
  int r;
  int sock;
  struct sockaddr_un sun;
  socklen_t sun_len;
  char abstract_pipe[] = "\0test-pipe";

  sock = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(sock != -1);

  sun_len = sizeof sun;
  memset(&sun, 0, sun_len);
  sun.sun_family = AF_UNIX;
  memcpy(sun.sun_path, abstract_pipe, sizeof abstract_pipe);

  r = bind(sock, (struct sockaddr*)&sun, sun_len);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &pipe_server, 0);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe_server, sock);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(memcmp(buf, abstract_pipe, sizeof abstract_pipe) == 0);

  uv_close((uv_handle_t*)&pipe_server, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  close(sock);

  ASSERT(pipe_close_cb_called == 1);
  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}